

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O1

bool __thiscall
cmStringCommand::RegexMatch
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *delimiter;
  pointer pbVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  long *plVar5;
  size_type *psVar6;
  pointer pbVar7;
  string output;
  string input;
  string e_1;
  RegularExpression re;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  undefined1 local_140 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  RegularExpression local_100;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
  local_100.regmatch.startp[0] = (char *)0x0;
  local_100.regmatch.endp[0] = (char *)0x0;
  local_100.regmatch.searchstring = (char *)0x0;
  local_100.program = (char *)0x0;
  bVar4 = cmsys::RegularExpression::compile(&local_100,pbVar1[2]._M_dataplus._M_p);
  if (!bVar4) {
    std::operator+(&local_180,"sub-command REGEX, mode MATCH failed to compile regex \"",pbVar1 + 2)
    ;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_180);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_160.field_2._M_allocated_capacity = *psVar6;
      local_160.field_2._8_8_ = plVar5[3];
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar6;
      local_160._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_160._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,
                      CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                               local_180.field_2._M_local_buf[0]) + 1);
    }
    cmCommand::SetError(&this->super_cmCommand,&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    bVar4 = false;
    goto LAB_002f73ba;
  }
  local_140._8_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_140._0_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 4;
  delimiter = &local_180.field_2;
  local_180._M_string_length = 0;
  local_180.field_2._M_local_buf[0] = '\0';
  local_180._M_dataplus._M_p = (pointer)delimiter;
  cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            (&local_160,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_140,delimiter->_M_local_buf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != delimiter) {
    operator_delete(local_180._M_dataplus._M_p,
                    CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                             local_180.field_2._M_local_buf[0]) + 1);
  }
  local_180._M_string_length = 0;
  local_180.field_2._M_local_buf[0] = '\0';
  local_180._M_dataplus._M_p = (pointer)delimiter;
  bVar4 = cmsys::RegularExpression::find(&local_100,local_160._M_dataplus._M_p,&local_100.regmatch);
  if (bVar4) {
    cmMakefile::StoreMatches((this->super_cmCommand).Makefile,&local_100);
    pcVar3 = local_100.regmatch.endp[0];
    pcVar2 = local_100.regmatch.startp[0];
    if (local_100.regmatch.endp[0] == local_100.regmatch.startp[0]) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120
                     ,"sub-command REGEX, mode MATCH regex \"",pbVar1 + 2);
      plVar5 = (long *)std::__cxx11::string::append(local_120._M_local_buf);
      pbVar7 = (pointer)(plVar5 + 2);
      if ((pointer)*plVar5 == pbVar7) {
        local_140._16_8_ = (pbVar7->_M_dataplus)._M_p;
        local_140._24_8_ = plVar5[3];
        local_140._0_8_ = (pointer)(local_140 + 0x10);
      }
      else {
        local_140._16_8_ = (pbVar7->_M_dataplus)._M_p;
        local_140._0_8_ = (pointer)*plVar5;
      }
      local_140._8_8_ = plVar5[1];
      *plVar5 = (long)pbVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_allocated_capacity != &local_110) {
        operator_delete((void *)local_120._M_allocated_capacity,local_110._M_allocated_capacity + 1)
        ;
      }
      cmCommand::SetError(&this->super_cmCommand,(string *)local_140);
      if ((pointer)local_140._0_8_ != (pointer)(local_140 + 0x10)) goto LAB_002f72a6;
    }
    else {
      std::__cxx11::string::substr((ulong)local_140,(ulong)&local_160);
      std::__cxx11::string::operator=((string *)&local_180,(string *)local_140);
      if ((pointer)local_140._0_8_ != (pointer)(local_140 + 0x10)) {
LAB_002f72a6:
        operator_delete((void *)local_140._0_8_,(ulong)(local_140._16_8_ + 1));
      }
    }
    if (pcVar3 != pcVar2) goto LAB_002f72bc;
    bVar4 = false;
  }
  else {
LAB_002f72bc:
    bVar4 = true;
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,pbVar1 + 3,local_180._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != delimiter) {
    operator_delete(local_180._M_dataplus._M_p,
                    CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                             local_180.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
LAB_002f73ba:
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  return bVar4;
}

Assistant:

bool cmStringCommand::RegexMatch(std::vector<std::string> const& args)
{
  //"STRING(REGEX MATCH <regular_expression> <output variable>
  // <input> [<input>...])\n";
  std::string const& regex = args[2];
  std::string const& outvar = args[3];

  this->Makefile->ClearMatches();
  // Compile the regular expression.
  cmsys::RegularExpression re;
  if (!re.compile(regex.c_str())) {
    std::string e =
      "sub-command REGEX, mode MATCH failed to compile regex \"" + regex +
      "\".";
    this->SetError(e);
    return false;
  }

  // Concatenate all the last arguments together.
  std::string input = cmJoin(cmMakeRange(args).advance(4), std::string());

  // Scan through the input for all matches.
  std::string output;
  if (re.find(input)) {
    this->Makefile->StoreMatches(re);
    std::string::size_type l = re.start();
    std::string::size_type r = re.end();
    if (r - l == 0) {
      std::string e = "sub-command REGEX, mode MATCH regex \"" + regex +
        "\" matched an empty string.";
      this->SetError(e);
      return false;
    }
    output = input.substr(l, r - l);
  }

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}